

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcSymbol * __thiscall CTcSymLocalBase::new_ctx_var(CTcSymLocalBase *this)

{
  CTcSymLocalBase *this_00;
  char *str;
  size_t sVar1;
  CTcSymLocal *in_RDI;
  CTcSymLocal *lcl;
  CTcSymLocal *in_stack_ffffffffffffffe0;
  
  this_00 = (CTcSymLocalBase *)CTcSymbolBase::operator_new(0x25c51d);
  str = CTcSymbolBase::get_sym((CTcSymbolBase *)0x25c52c);
  sVar1 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x25c53d);
  CTcSymLocal::CTcSymLocal
            (in_stack_ffffffffffffffe0,str,(size_t)this_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             (int)(sVar1 >> 0x20));
  set_ctx_orig(this_00,in_RDI);
  if ((*(ushort *)&(in_RDI->super_CTcSymLocalBase).field_0x64 >> 4 & 1) == 0) {
    set_ctx_level(this_00,1);
  }
  else {
    set_ctx_level(this_00,(in_RDI->super_CTcSymLocalBase).ctx_level_ + 1);
  }
  return &this_00->super_CTcSymbol;
}

Assistant:

CTcSymbol *CTcSymLocalBase::new_ctx_var() const
{
    /* create a new local with the same name */
    CTcSymLocal *lcl = new CTcSymLocal(
        get_sym(), get_sym_len(), FALSE, FALSE, 0);

    /* refer the copy back to the original (i.e., me) */
    lcl->set_ctx_orig((CTcSymLocal *)this);

    /* set up the context variable information */
    if (!is_ctx_local_)
    {
        /* 
         *   The original is a true local - we're at the first context
         *   level, and we don't yet have a property assigned, since we
         *   don't know if this variable is actually going to be
         *   referenced. 
         */
        lcl->set_ctx_level(1);
    }
    else
    {
        /* 
         *   The original was already a context variable - we're at one
         *   higher context level in this function, and we use the same
         *   context property as the original did.  
         */
        lcl->set_ctx_level(ctx_level_ + 1);
    }

    /* return the new symbol */
    return lcl;
}